

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGL3DriverBase::initQuadsIndices(COpenGL3DriverBase *this,int max_vertex_count)

{
  int iVar1;
  unsigned_short uVar2;
  int iVar3;
  unsigned_short local_4a;
  vector<unsigned_short,_std::allocator<unsigned_short>_> QuadsIndices;
  
  iVar1 = max_vertex_count / 4;
  QuadsIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  QuadsIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  QuadsIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&QuadsIndices,
             (long)(iVar1 * 6));
  iVar3 = 0;
  if (iVar1 < 1) {
    iVar1 = iVar3;
  }
  for (; iVar1 << 2 != iVar3; iVar3 = iVar3 + 4) {
    uVar2 = (unsigned_short)iVar3;
    local_4a = uVar2;
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&QuadsIndices,&local_4a);
    local_4a = uVar2 + 1;
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&QuadsIndices,&local_4a);
    local_4a = uVar2 + 2;
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&QuadsIndices,&local_4a);
    local_4a = uVar2;
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&QuadsIndices,&local_4a);
    local_4a = uVar2 + 2;
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&QuadsIndices,&local_4a);
    local_4a = uVar2 + 3;
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&QuadsIndices,&local_4a);
  }
  (*GL.GenBuffers)(1,&this->QuadIndexBuffer);
  (*GL.BindBuffer)(0x8892,this->QuadIndexBuffer);
  (*GL.BufferData)(0x8892,(long)QuadsIndices.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)QuadsIndices.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                   QuadsIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start,0x88e4);
  (*GL.BindBuffer)(0x8892,0);
  this->QuadIndexCount =
       (uint)((ulong)((long)QuadsIndices.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)QuadsIndices.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 1);
  ::std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&QuadsIndices);
  return;
}

Assistant:

void COpenGL3DriverBase::initQuadsIndices(int max_vertex_count)
{
	int max_quad_count = max_vertex_count / 4;
	std::vector<GLushort> QuadsIndices;
	QuadsIndices.reserve(6 * max_quad_count);
	for (int k = 0; k < max_quad_count; k++) {
		QuadsIndices.push_back(4 * k + 0);
		QuadsIndices.push_back(4 * k + 1);
		QuadsIndices.push_back(4 * k + 2);
		QuadsIndices.push_back(4 * k + 0);
		QuadsIndices.push_back(4 * k + 2);
		QuadsIndices.push_back(4 * k + 3);
	}
	GL.GenBuffers(1, &QuadIndexBuffer);
	GL.BindBuffer(GL_ARRAY_BUFFER, QuadIndexBuffer);
	GL.BufferData(GL_ARRAY_BUFFER, sizeof(QuadsIndices[0]) * QuadsIndices.size(), QuadsIndices.data(), GL_STATIC_DRAW);
	GL.BindBuffer(GL_ARRAY_BUFFER, 0);
	QuadIndexCount = QuadsIndices.size();
}